

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int encoder_append_uint_value(ndn_encoder_t *encoder,uint64_t value)

{
  uint64_t value_local;
  ndn_encoder_t *encoder_local;
  
  if (value < 0x100) {
    encoder_local._4_4_ = encoder_append_byte_value(encoder,(uint8_t)value);
  }
  else if (value < 0x10000) {
    encoder_local._4_4_ = encoder_append_uint16_value(encoder,(uint16_t)value);
  }
  else if (value < 0x100000000) {
    encoder_local._4_4_ = encoder_append_uint32_value(encoder,(uint32_t)value);
  }
  else {
    encoder_local._4_4_ = encoder_append_uint64_value(encoder,value);
  }
  return encoder_local._4_4_;
}

Assistant:

static inline int
encoder_append_uint_value(ndn_encoder_t* encoder, uint64_t value)
{
  if (value <= 255) {
    return encoder_append_byte_value(encoder, (uint8_t)value);
  }
  else if (value <= 0xFFFF) {
    return encoder_append_uint16_value(encoder, (uint16_t)value);
  }
  else if (value <= 0xFFFFFFFF) {
    return encoder_append_uint32_value(encoder, (uint32_t)value);
  }
  else {
    return encoder_append_uint64_value(encoder, value);
  }
}